

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsectoreffect.cpp
# Opt level: O3

EMoveResult __thiscall
sector_t::MoveFloor(sector_t *this,double speed,double dest,int crush,int direction,bool hexencrush)

{
  double dVar1;
  undefined4 uVar2;
  bool bVar3;
  EMoveResult EVar4;
  uint uVar5;
  double dVar6;
  double local_68;
  undefined8 local_48;
  
  dVar1 = (this->floorplane).D;
  local_48._0_4_ = SUB84(speed,0);
  uVar2 = (undefined4)local_48;
  local_48._4_4_ = (uint)((ulong)speed >> 0x20);
  if (direction == 1) {
    dVar6 = (this->ceilingplane).normal.X;
    if ((((((dVar6 == 0.0) && (!NAN(dVar6))) &&
          (dVar6 = (this->ceilingplane).normal.Y, dVar6 == 0.0)) &&
         ((!NAN(dVar6) && (dVar6 = (this->floorplane).normal.X, dVar6 == 0.0)))) &&
        ((!NAN(dVar6) && ((dVar6 = (this->floorplane).normal.Y, dVar6 == 0.0 && (!NAN(dVar6)))))))
       && ((sectorPortals.Array[this->Portals[1]].mType != 3 &&
           ((((byte)i_compatflags2 & 2) == 0 && (dVar6 = (this->ceilingplane).D, dVar6 < -dest))))))
    {
      dest = -dVar6;
    }
    dVar6 = dVar1 - (this->floorplane).normal.Z * speed;
    if (dVar6 <= dest) goto LAB_00381bf7;
    EVar4 = crushed;
    bVar3 = MoveAttached(this,crush,speed,0,true);
    if (!bVar3) {
      return crushed;
    }
    (this->floorplane).D = dVar6;
    bVar3 = P_ChangeSector((sector_t_conflict *)this,crush,speed,0,false);
    if (!bVar3) {
      this->planes[0].TexZ =
           ((this->floorplane).D - dVar1) * (this->floorplane).negiC + this->planes[0].TexZ;
      AdjustFloorClip(this);
      return ok;
    }
    if (-1 < crush && !hexencrush) {
      dVar6 = (this->floorplane).D;
      goto LAB_00381d0e;
    }
    (this->floorplane).D = dVar1;
    uVar5 = local_48._4_4_ ^ 0x80000000;
    local_48 = -speed;
  }
  else {
    if (direction != -1) {
      return ok;
    }
    dVar6 = (this->floorplane).normal.Z * speed + dVar1;
    if (dest <= dVar6) {
LAB_00381bf7:
      dVar6 = (dest - dVar1) * (this->floorplane).negiC;
      bVar3 = MoveAttached(this,crush,dVar6,0,true);
      if (!bVar3) {
        return crushed;
      }
      (this->floorplane).D = dest;
      bVar3 = P_ChangeSector((sector_t_conflict *)this,crush,dVar6,0,false);
      if (bVar3) {
        (this->floorplane).D = dVar1;
        local_68 = -dVar6;
        P_ChangeSector((sector_t_conflict *)this,crush,-dVar6,0,true);
        P_Scroll3dMidtex((sector_t_conflict *)this,crush,local_68,false);
        P_MoveLinkedSectors((sector_t_conflict *)this,crush,local_68,false);
      }
      else {
        this->planes[0].TexZ = dVar6 + this->planes[0].TexZ;
        AdjustFloorClip(this);
      }
      return pastdest;
    }
    bVar3 = MoveAttached(this,crush,-speed,0,true);
    if (!bVar3) {
      return crushed;
    }
    (this->floorplane).D = dVar6;
    EVar4 = ok;
    bVar3 = P_ChangeSector((sector_t_conflict *)this,crush,-speed,0,false);
    if (!bVar3) {
      dVar6 = (this->floorplane).D;
LAB_00381d0e:
      this->planes[0].TexZ = (dVar6 - dVar1) * (this->floorplane).negiC + this->planes[0].TexZ;
      AdjustFloorClip(this);
      return EVar4;
    }
    (this->floorplane).D = dVar1;
    uVar5 = local_48._4_4_;
    local_48 = speed;
  }
  P_ChangeSector((sector_t_conflict *)this,crush,(double)CONCAT44(uVar5,uVar2),0,true);
  P_Scroll3dMidtex((sector_t_conflict *)this,crush,local_48,false);
  P_MoveLinkedSectors((sector_t_conflict *)this,crush,local_48,false);
  return crushed;
}

Assistant:

EMoveResult sector_t::MoveFloor(double speed, double dest, int crush, int direction, bool hexencrush)
{
	bool	 	flag;
	double 	lastpos;
	double		movedest;
	double		move;
	//double		destheight;	//jff 02/04/98 used to keep floors/ceilings
							// from moving thru each other
	lastpos = floorplane.fD();
	switch (direction)
	{
	case -1:
		// DOWN
		movedest = floorplane.GetChangedHeight(-speed);
		if (movedest >= dest)
		{
			move = floorplane.HeightDiff(lastpos, dest);

			if (!MoveAttached(crush, move, 0, true)) return EMoveResult::crushed;

			floorplane.setD(dest);
			flag = P_ChangeSector(this, crush, move, 0, false);
			if (flag)
			{
				floorplane.setD(lastpos);
				P_ChangeSector(this, crush, -move, 0, true);
				MoveAttached(crush, -move, 0, false);
			}
			else
			{
				ChangePlaneTexZ(sector_t::floor, move);
				AdjustFloorClip();
			}
			return EMoveResult::pastdest;
		}
		else
		{
			if (!MoveAttached(crush, -speed, 0, true)) return EMoveResult::crushed;

			floorplane.setD(movedest);

			flag = P_ChangeSector(this, crush, -speed, 0, false);
			if (flag)
			{
				floorplane.setD(lastpos);
				P_ChangeSector(this, crush, speed, 0, true);
				MoveAttached(crush, speed, 0, false);
				return EMoveResult::crushed;
			}
			else
			{
				ChangePlaneTexZ(sector_t::floor, floorplane.HeightDiff(lastpos));
				AdjustFloorClip();
			}
		}
		break;

	case 1:
		// UP
		// jff 02/04/98 keep floor from moving thru ceilings
		// [RH] not so easy with arbitrary planes
		//destheight = (dest < ceilingheight) ? dest : ceilingheight;
		if (!ceilingplane.isSlope() && !floorplane.isSlope() &&
			!PortalIsLinked(sector_t::ceiling) &&
			(!(i_compatflags2 & COMPATF2_FLOORMOVE) && -dest > ceilingplane.fD()))
		{
			dest = -ceilingplane.fD();
		}

		movedest = floorplane.GetChangedHeight(speed);

		if (movedest <= dest)
		{
			move = floorplane.HeightDiff(lastpos, dest);

			if (!MoveAttached(crush, move, 0, true)) return EMoveResult::crushed;

			floorplane.setD(dest);

			flag = P_ChangeSector(this, crush, move, 0, false);
			if (flag)
			{
				floorplane.setD(lastpos);
				P_ChangeSector(this, crush, -move, 0, true);
				MoveAttached(crush, -move, 0, false);
			}
			else
			{
				ChangePlaneTexZ(sector_t::floor, move);
				AdjustFloorClip();
			}
			return EMoveResult::pastdest;
		}
		else
		{
			if (!MoveAttached(crush, speed, 0, true)) return EMoveResult::crushed;

			floorplane.setD(movedest);

			// COULD GET CRUSHED
			flag = P_ChangeSector(this, crush, speed, 0, false);
			if (flag)
			{
				if (crush >= 0 && !hexencrush)
				{
					ChangePlaneTexZ(sector_t::floor, floorplane.HeightDiff(lastpos));
					AdjustFloorClip();
					return EMoveResult::crushed;
				}
				floorplane.setD(lastpos);
				P_ChangeSector(this, crush, -speed, 0, true);
				MoveAttached(crush, -speed, 0, false);
				return EMoveResult::crushed;
			}
			ChangePlaneTexZ(sector_t::floor, floorplane.HeightDiff(lastpos));
			AdjustFloorClip();
		}
		break;
	}
	return EMoveResult::ok;
}